

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryCamera(aiCamera *cam)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t old;
  uint32_t len;
  aiCamera *cam_local;
  
  ofs = WriteMagic(0x1234);
  uVar1 = Write<aiString>(&cam->mName);
  uVar2 = Write<aiVector3t<float>>(&cam->mPosition);
  uVar3 = Write<aiVector3t<float>>(&cam->mLookAt);
  uVar4 = Write<aiVector3t<float>>(&cam->mUp);
  uVar5 = Write<float>(&cam->mHorizontalFOV);
  uVar6 = Write<float>(&cam->mClipPlaneNear);
  uVar7 = Write<float>(&cam->mClipPlaneFar);
  uVar8 = Write<float>(&cam->mAspect);
  uVar8 = uVar8 + uVar7 + uVar6 + uVar5 + uVar4 + uVar3 + uVar2 + uVar1;
  ChangeInteger(ofs,uVar8);
  return uVar8;
}

Assistant:

uint32_t WriteBinaryCamera(const aiCamera* cam)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AICAMERA);

	len += Write<aiString>(cam->mName);
	len += Write<aiVector3D>(cam->mPosition);
	len += Write<aiVector3D>(cam->mLookAt);
	len += Write<aiVector3D>(cam->mUp);
	len += Write<float>(cam->mHorizontalFOV);
	len += Write<float>(cam->mClipPlaneNear);
	len += Write<float>(cam->mClipPlaneFar);
	len += Write<float>(cam->mAspect);

	ChangeInteger(old,len);
	return len;
}